

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spline.cpp
# Opt level: O2

bool __thiscall SplineSolver<5U,_2U>::build_solver(SplineSolver<5U,_2U> *this,int N,int M)

{
  SparseMatrix<double,_0,_int> *this_00;
  ulong col;
  long row;
  uint uVar1;
  ComputationInfo CVar2;
  ulong uVar3;
  Scalar *pSVar4;
  ostream *poVar5;
  long lVar6;
  long lVar7;
  ulong row_00;
  Scalar local_7c;
  SparseMatrix<double,_0,_int> local_78;
  
  lVar7 = (long)M;
  Eigen::SparseMatrix<double,_0,_int>::SparseMatrix(&local_78,lVar7,lVar7);
  this_00 = &this->A;
  Eigen::SparseMatrix<double,_0,_int>::operator=(this_00,&local_78);
  Eigen::SparseMatrix<double,_0,_int>::~SparseMatrix(&local_78);
  local_7c = 6;
  Eigen::DenseBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::Constant
            ((DenseBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *)&local_78,lVar7,&local_7c);
  Eigen::SparseMatrix<double,0,int>::
  reserveInnerVectors<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<int>,Eigen::Matrix<int,_1,1,0,_1,1>>>
            ((SparseMatrix<double,0,int> *)this_00,
             (CwiseNullaryOp<Eigen::internal::scalar_constant_op<int>,_Eigen::Matrix<int,__1,_1,_0,__1,_1>_>
              *)&local_78);
  uVar1 = N - 2;
  lVar7 = (long)(int)uVar1;
  uVar3 = 0;
  if (0 < (int)uVar1) {
    uVar3 = (ulong)uVar1;
  }
  col = 0;
  while (row_00 = col, uVar3 != row_00) {
    pSVar4 = Eigen::SparseMatrix<double,_0,_int>::insert(this_00,row_00,row_00);
    *pSVar4 = 16.0;
    row = lVar7 + row_00;
    pSVar4 = Eigen::SparseMatrix<double,_0,_int>::insert(this_00,row,row_00);
    *pSVar4 = 0.0;
    pSVar4 = Eigen::SparseMatrix<double,_0,_int>::insert(this_00,row_00,row);
    *pSVar4 = 0.0;
    pSVar4 = Eigen::SparseMatrix<double,_0,_int>::insert(this_00,row,row);
    *pSVar4 = -6.0;
    if (row_00 != 0) {
      pSVar4 = Eigen::SparseMatrix<double,_0,_int>::insert(this_00,row_00,row_00 - 1);
      *pSVar4 = 7.0;
      pSVar4 = Eigen::SparseMatrix<double,_0,_int>::insert(this_00,row,row_00 - 1);
      *pSVar4 = 8.0;
      lVar6 = row_00 + lVar7 + -1;
      pSVar4 = Eigen::SparseMatrix<double,_0,_int>::insert(this_00,row_00,lVar6);
      *pSVar4 = 1.0;
      pSVar4 = Eigen::SparseMatrix<double,_0,_int>::insert(this_00,row,lVar6);
      *pSVar4 = 1.0;
    }
    col = row_00 + 1;
    if ((long)row_00 < (long)(N + -3)) {
      pSVar4 = Eigen::SparseMatrix<double,_0,_int>::insert(this_00,row_00,col);
      *pSVar4 = 7.0;
      pSVar4 = Eigen::SparseMatrix<double,_0,_int>::insert(this_00,row,col);
      *pSVar4 = -8.0;
      lVar6 = lVar7 + row_00 + 1;
      pSVar4 = Eigen::SparseMatrix<double,_0,_int>::insert(this_00,row_00,lVar6);
      *pSVar4 = -1.0;
      pSVar4 = Eigen::SparseMatrix<double,_0,_int>::insert(this_00,row,lVar6);
      *pSVar4 = 1.0;
    }
  }
  Eigen::SparseMatrix<double,_0,_int>::makeCompressed(this_00);
  Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>::compute
            (&this->solver,this_00);
  CVar2 = Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>::info
                    (&this->solver);
  if (CVar2 != Success) {
    poVar5 = std::operator<<((ostream *)&std::cout,"inverse failed");
    std::endl<char,std::char_traits<char>>(poVar5);
  }
  return CVar2 == Success;
}

Assistant:

bool SplineSolver<5, Dims>::build_solver(const int N, const int M)
{
    A = SparseMatrix<double>(M, M);
    A.reserve(VectorXi::Constant(M, 6));

    for (int k = 0; k<N-2; ++k)
    {
        A.insert(k, k) = 16;
        A.insert(N-2+k, k) = 0;
        A.insert(k, N-2+k) = 0;
        A.insert(N-2+k, N-2+k) = -6;

        if (k > 0)
        {
            A.insert(k, k-1) = 7;
            A.insert(N-2+k, k-1) = 8;
            A.insert(k, N-2+k-1) = 1;
            A.insert(N-2+k, N-2+k-1) = 1;
        }

        if (k < N-3)
        {
            A.insert(k, k+1) = 7;
            A.insert(N-2+k, k+1) = -8;
            A.insert(k, N-2+k+1) = -1;
            A.insert(N-2+k, N-2+k+1) = 1;
        }
    }

    A.makeCompressed();
    solver.compute(A);

    if (solver.info() != Success)
    {
        cout << "inverse failed" << endl;
        return false;
    }

    return true;
}